

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void prefix_identifier(ch_compilation *comp)

{
  _Bool _Var1;
  undefined4 local_5c;
  undefined4 local_58;
  ch_op op_2;
  ch_op op_1;
  ch_op op;
  ch_token identifier;
  ch_token token;
  ch_compilation *comp_local;
  
  identifier.line = (comp->previous).kind;
  identifier._28_4_ = *(undefined4 *)&(comp->previous).field_0x4;
  _Var1 = consume(comp,TK_ID,"Expected identifier",(ch_token *)&op_1);
  if (_Var1) {
    load_variable(comp,(ch_lexeme)identifier._0_16_);
    if (identifier.line == 5) {
      op_2 = OP_ADDONE;
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,&op_2,1);
    }
    else {
      local_58 = 9;
      ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_58,1);
    }
    local_5c = 3;
    ch_emit_write(&((comp->emit).emit_scope)->bytecode,&local_5c,1);
    set_variable(comp,(ch_lexeme)identifier._0_16_);
  }
  return;
}

Assistant:

void prefix_identifier(ch_compilation *comp) {
  ch_token token = comp->previous;
  ch_token identifier;
  if (!consume(comp, TK_ID, "Expected identifier", &identifier)) return;

  load_variable(comp, identifier.lexeme);

  if (token.kind == TK_PLUS_PLUS) {
    EMIT_OP(GET_EMIT(comp), OP_ADDONE);
  } else {
    EMIT_OP(GET_EMIT(comp), OP_SUBONE);
  }

  // Duplicate its value so that the new value stays on the stack
  EMIT_OP(GET_EMIT(comp), OP_TOP);
  set_variable(comp, identifier.lexeme);
  return;
}